

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall higan::FileForAppend::Append(FileForAppend *this,char *data,size_t len)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = fwrite_unlocked(data,1,len,(FILE *)this->file_fp_);
  do {
    if (len <= uVar2) {
LAB_001085b7:
      this->write_sum_bytes_ = this->write_sum_bytes_ + uVar2;
      return;
    }
    sVar3 = fwrite_unlocked(data + uVar2,1,len - uVar2,(FILE *)this->file_fp_);
    if (sVar3 == 0) {
      iVar1 = ferror((FILE *)this->file_fp_);
      if (iVar1 != 0) {
        Append();
      }
      goto LAB_001085b7;
    }
    uVar2 = uVar2 + sVar3;
  } while( true );
}

Assistant:

void FileForAppend::Append(const char* data, size_t len)
{
	size_t has_writen = 0;
	/**
	 * 默认第一次 成功..
	 */
	size_t write_result = Write(data, len);

	has_writen += write_result;

	while (has_writen < len)
	{
		write_result = Write(data + has_writen, len - has_writen);
		if (write_result > 0)
		{
			has_writen += write_result;
		}
		else if (write_result == 0)
		{
			int error = ferror(file_fp_);
			if (error)
			{
				fprintf(stderr, "write file %s error error msg is: %s",
						url_.c_str(), strerror(error));
			}
			break;
		}
	}

	write_sum_bytes_ += has_writen;
}